

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

bool deqp::egl::anon_unknown_3::checkVersionString
               (TestLog *log,Functions *gl,bool desktop,int major,int minor)

{
  GLubyte *pGVar1;
  Functions *gl_00;
  GLenum GVar2;
  MessageBuilder *pMVar3;
  bool bVar4;
  MessageBuilder local_15b0;
  MessageBuilder local_1430;
  MessageBuilder local_12b0;
  MessageBuilder local_1130;
  GLint local_fac;
  undefined1 local_fa8 [4];
  deInt32 profile_1;
  GLint local_e24;
  undefined1 local_e20 [4];
  deInt32 profile;
  allocator<char> local_c99;
  string local_c98;
  ApiType local_c74;
  MessageBuilder local_c70;
  MessageBuilder local_af0;
  MessageBuilder local_970;
  MessageBuilder local_7f0;
  int local_66c;
  undefined1 local_668 [4];
  int val_1;
  MessageBuilder local_4e8;
  MessageBuilder local_368;
  int local_1e8;
  int val;
  MessageBuilder local_1d8;
  GLubyte *local_58;
  char *prefixIter;
  char *prefix;
  int minorVersion;
  int majorVersion;
  char *iter;
  char *versionStr;
  int local_28;
  int minor_local;
  int major_local;
  bool desktop_local;
  Functions *gl_local;
  TestLog *log_local;
  
  versionStr._4_4_ = minor;
  local_28 = major;
  minor_local._3_1_ = desktop;
  _major_local = gl;
  gl_local = (Functions *)log;
  iter = (char *)(*gl->getString)(0x1f02);
  gl_00 = _major_local;
  prefix._4_4_ = 0;
  prefix._0_4_ = 0;
  _minorVersion = (GLubyte *)iter;
  if ((minor_local._3_1_ & 1) == 0) {
    if (local_28 == 1) {
      prefixIter = "OpenGL ES-CM ";
    }
    else {
      prefixIter = "OpenGL ES ";
    }
    for (local_58 = (GLubyte *)prefixIter; *local_58 != '\0'; local_58 = local_58 + 1) {
      if (*local_58 != *_minorVersion) {
        tcu::TestLog::operator<<
                  (&local_1d8,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (&local_1d8,(char (*) [42])"Invalid version string prefix. Expected \'");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&prefixIter);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])"\'.");
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d8);
        return false;
      }
      _minorVersion = _minorVersion + 1;
    }
  }
  while( true ) {
    bVar4 = false;
    if (*_minorVersion != '\0') {
      bVar4 = *_minorVersion != '.';
    }
    if (!bVar4) break;
    local_1e8 = (char)*_minorVersion + -0x30;
    if ((local_1e8 < 0) || (9 < local_1e8)) {
      tcu::TestLog::operator<<
                (&local_368,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_368,
                          (char (*) [52])"Failed to parse major version number. Not a number.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_368);
      return false;
    }
    if ((prefix._4_4_ == 0) && (local_1e8 == 0)) {
      tcu::TestLog::operator<<
                (&local_4e8,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_4e8,
                          (char (*) [56])"Failed to parse major version number. Begins with zero.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e8);
      return false;
    }
    prefix._4_4_ = prefix._4_4_ * 10 + local_1e8;
    _minorVersion = _minorVersion + 1;
  }
  pGVar1 = _minorVersion;
  if (*_minorVersion != '.') {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_668,(TestLog *)gl_local,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_668,
                        (char (*) [66])
                        "Failed to parse version. Expected \'.\' after major version number.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_668);
    return false;
  }
  while( true ) {
    _minorVersion = pGVar1 + 1;
    bVar4 = false;
    if ((*_minorVersion != '\0') && (bVar4 = false, *_minorVersion != ' ')) {
      bVar4 = *_minorVersion != '.';
    }
    if (!bVar4) break;
    local_66c = (char)*_minorVersion + -0x30;
    if ((local_66c < 0) || (9 < local_66c)) {
      tcu::TestLog::operator<<
                (&local_7f0,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_7f0,
                          (char (*) [52])"Failed to parse minor version number. Not a number.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7f0);
      return false;
    }
    if (((((int)prefix == 0) && (local_66c == 0)) && (pGVar1[2] != ' ')) &&
       ((pGVar1[2] != '.' && (pGVar1[2] != '\0')))) {
      tcu::TestLog::operator<<
                (&local_970,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_970,
                          (char (*) [53])"Failed to parse minor version number. Leading zeros.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_970);
      return false;
    }
    prefix._0_4_ = (int)prefix * 10 + local_66c;
    pGVar1 = _minorVersion;
  }
  if (((*_minorVersion != ' ') && (*_minorVersion != '.')) && (*_minorVersion != '\0')) {
    return false;
  }
  if ((minor_local._3_1_ & 1) != 0) {
    if (prefix._4_4_ < local_28) {
      tcu::TestLog::operator<<
                (&local_af0,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_af0,(char (*) [37])"Major version is less than required.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_af0);
      return false;
    }
    if ((prefix._4_4_ == local_28) && ((int)prefix < versionStr._4_4_)) {
      tcu::TestLog::operator<<
                (&local_c70,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_c70,(char (*) [37])"Minor version is less than required.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_c70);
      return false;
    }
    if ((prefix._4_4_ == local_28) && ((int)prefix == versionStr._4_4_)) {
      return true;
    }
    if ((2 < local_28) && ((local_28 != 3 || (versionStr._4_4_ != 0)))) {
      if ((local_28 != 3) || (versionStr._4_4_ != 1)) {
        tcu::TestLog::operator<<
                  (&local_12b0,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (&local_12b0,
                            (char (*) [45])"Couldn\'t do any further compatibilyt checks.");
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_12b0);
        return true;
      }
      if ((prefix._4_4_ < 4) && ((prefix._4_4_ != 3 || ((int)prefix < 1)))) {
        return false;
      }
      local_fac = 0;
      (*_major_local->getIntegerv)(0x9126,&local_fac);
      GVar2 = (*_major_local->getError)();
      glu::checkError(GVar2,"glGetIntegerv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                      ,0x250);
      if (local_fac == 1) {
        return true;
      }
      tcu::TestLog::operator<<
                (&local_1130,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_1130,
                          (char (*) [61])
                          "Required OpenGL 3.1. Got later version without core profile.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1130);
      return false;
    }
    if ((prefix._4_4_ == 3) && ((int)prefix == 1)) {
      local_c74 = glu::ApiType::core(3,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c98,"GL_ARB_compatibility",&local_c99);
      bVar4 = glu::hasExtension(gl_00,local_c74,&local_c98);
      std::__cxx11::string::~string((string *)&local_c98);
      std::allocator<char>::~allocator(&local_c99);
      if (!bVar4) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_e20,(TestLog *)gl_local,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_e20,
                            (char (*) [77])
                            "Required OpenGL 3.0 or earlier. Got OpenGL 3.1 without GL_ARB_compatibility."
                           );
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_e20);
        return false;
      }
      return true;
    }
    if ((prefix._4_4_ < 4) && ((prefix._4_4_ != 3 || ((int)prefix < versionStr._4_4_)))) {
      return false;
    }
    local_e24 = 0;
    (*_major_local->getIntegerv)(0x9126,&local_e24);
    GVar2 = (*_major_local->getError)();
    glu::checkError(GVar2,"glGetIntegerv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                    ,0x23a);
    if (local_e24 == 2) {
      return true;
    }
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_fa8,(TestLog *)gl_local,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_fa8,
                        (char (*) [81])
                        "Required OpenGL 3.0 or earlier. Got later version without compatibility profile."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_fa8);
    return false;
  }
  if (prefix._4_4_ < local_28) {
    tcu::TestLog::operator<<
              (&local_1430,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1430,(char (*) [37])"Major version is less than required.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1430);
    return false;
  }
  if ((prefix._4_4_ == local_28) && ((int)prefix < versionStr._4_4_)) {
    tcu::TestLog::operator<<
              (&local_15b0,(TestLog *)gl_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_15b0,(char (*) [37])"Minor version is less than required.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_15b0);
    return false;
  }
  return true;
}

Assistant:

bool checkVersionString (TestLog& log, const glw::Functions& gl, bool desktop, int major, int minor)
{
	const char* const	versionStr	= (const char*)gl.getString(GL_VERSION);
	const char*			iter		= versionStr;

	int majorVersion = 0;
	int minorVersion = 0;

	// Check embedded version prefixes
	if (!desktop)
	{
		const char* prefix		= NULL;
		const char* prefixIter	= NULL;

		if (major == 1)
			prefix = "OpenGL ES-CM ";
		else
			prefix = "OpenGL ES ";

		prefixIter = prefix;

		while (*prefixIter)
		{
			if ((*prefixIter) != (*iter))
			{
				log << TestLog::Message << "Invalid version string prefix. Expected '" << prefix << "'." << TestLog::EndMessage;
				return false;
			}

			prefixIter++;
			iter++;
		}
	}

	while ((*iter) && (*iter) != '.')
	{
		const int val = (*iter) - '0';

		// Not a number
		if (val < 0 || val > 9)
		{
			log << TestLog::Message << "Failed to parse major version number. Not a number." << TestLog::EndMessage;
			return false;
		}

		// Leading zero
		if (majorVersion == 0 && val == 0)
		{
			log << TestLog::Message << "Failed to parse major version number. Begins with zero." << TestLog::EndMessage;
			return false;
		}

		majorVersion = majorVersion * 10 + val;

		iter++;
	}

	// Invalid format
	if ((*iter) != '.')
	{
		log << TestLog::Message << "Failed to parse version. Expected '.' after major version number." << TestLog::EndMessage;
		return false;
	}

	iter++;

	while ((*iter) && (*iter) != ' ' && (*iter) != '.')
	{
		const int val = (*iter) - '0';

		// Not a number
		if (val < 0 || val > 9)
		{
			log << TestLog::Message << "Failed to parse minor version number. Not a number." << TestLog::EndMessage;
			return false;
		}

		// Leading zero
		if (minorVersion == 0 && val == 0)
		{
			// Leading zeros in minor version
			if ((*(iter + 1)) != ' ' && (*(iter + 1)) != '.' && (*(iter + 1)) != '\0')
			{
				log << TestLog::Message << "Failed to parse minor version number. Leading zeros." << TestLog::EndMessage;
				return false;
			}
		}

		minorVersion = minorVersion * 10 + val;

		iter++;
	}

	// Invalid format
	if ((*iter) != ' ' && (*iter) != '.' && (*iter) != '\0')
		return false;

	if (desktop)
	{
		if (majorVersion < major)
		{
			log << TestLog::Message << "Major version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion < minor)
		{
			log << TestLog::Message << "Minor version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion == minor)
			return true;

		if (major < 3 || (major == 3 && minor == 0))
		{
			if (majorVersion == 3 && minorVersion == 1)
			{
				if (glu::hasExtension(gl, glu::ApiType::core(3, 1), "GL_ARB_compatibility"))
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.0 or earlier. Got OpenGL 3.1 without GL_ARB_compatibility." << TestLog::EndMessage;
					return false;
				}
			}
			else if (majorVersion > 3 || (majorVersion == 3 && minorVersion >= minor))
			{
				deInt32 profile = 0;

				gl.getIntegerv(GL_CONTEXT_PROFILE_MASK, &profile);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

				if (profile == GL_CONTEXT_COMPATIBILITY_PROFILE_BIT)
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.0 or earlier. Got later version without compatibility profile." << TestLog::EndMessage;
					return false;
				}
			}
			else
				DE_ASSERT(false);

			return false;
		}
		else if (major == 3 && minor == 1)
		{
			if (majorVersion > 3 || (majorVersion == 3 && minorVersion >= minor))
			{
				deInt32 profile = 0;

				gl.getIntegerv(GL_CONTEXT_PROFILE_MASK, &profile);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

				if (profile == GL_CONTEXT_CORE_PROFILE_BIT)
					return true;
				else
				{
					log << TestLog::Message << "Required OpenGL 3.1. Got later version without core profile." << TestLog::EndMessage;
					return false;
				}
			}
			else
				DE_ASSERT(false);

			return false;
		}
		else
		{
			log << TestLog::Message << "Couldn't do any further compatibilyt checks." << TestLog::EndMessage;
			return true;
		}
	}
	else
	{
		if (majorVersion < major)
		{
			log << TestLog::Message << "Major version is less than required." << TestLog::EndMessage;
			return false;
		}
		else if (majorVersion == major && minorVersion < minor)
		{
			log << TestLog::Message << "Minor version is less than required." << TestLog::EndMessage;
			return false;
		}
		else
			return true;
	}
}